

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSelect(PrintExpressionContents *this,Select *curr)

{
  ulong uVar1;
  ostream *poVar2;
  
  poVar2 = prepareColor(this->o);
  std::operator<<(poVar2,"select");
  Colors::normal(this->o);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id;
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    std::operator<<(this->o,' ');
    printResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)17>).
                               super_Expression.type.id);
    return;
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    prepareColor(o) << "select";
    restoreNormalColor(o);
    if (curr->type.isRef()) {
      o << ' ';
      printResultType(curr->type);
    }
  }